

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAbbreviationDeclaration.cpp
# Opt level: O2

size_t __thiscall
llvm::DWARFAbbreviationDeclaration::FixedSizeInfo::getByteSize(FixedSizeInfo *this,DWARFUnit *U)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  size_t sVar4;
  
  lVar3 = (ulong)(U->Header).FormParams.AddrSize * (ulong)this->NumAddrs;
  if ((ulong)this->NumAddrs == 0) {
    lVar3 = 0;
  }
  sVar4 = lVar3 + (ulong)this->NumBytes;
  bVar1 = this->NumRefAddrs;
  if ((ulong)bVar1 != 0) {
    bVar2 = dwarf::FormParams::getRefAddrByteSize(&(U->Header).FormParams);
    sVar4 = sVar4 + (ulong)bVar2 * (ulong)bVar1;
  }
  bVar1 = this->NumDwarfOffsets;
  if ((ulong)bVar1 != 0) {
    bVar2 = dwarf::FormParams::getDwarfOffsetByteSize(&(U->Header).FormParams);
    sVar4 = sVar4 + (ulong)bVar2 * (ulong)bVar1;
  }
  return sVar4;
}

Assistant:

size_t DWARFAbbreviationDeclaration::FixedSizeInfo::getByteSize(
    const DWARFUnit &U) const {
  size_t ByteSize = NumBytes;
  if (NumAddrs)
    ByteSize += NumAddrs * U.getAddressByteSize();
  if (NumRefAddrs)
    ByteSize += NumRefAddrs * U.getRefAddrByteSize();
  if (NumDwarfOffsets)
    ByteSize += NumDwarfOffsets * U.getDwarfOffsetByteSize();
  return ByteSize;
}